

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O2

void __thiscall
Annotator_retrieveDuplicateIdItemsWithIndex_Test::TestBody
          (Annotator_retrieveDuplicateIdItemsWithIndex_Test *this)

{
  pointer ppVar1;
  bool bVar2;
  undefined4 uVar3;
  mapped_type *pmVar4;
  long lVar5;
  char *pcVar6;
  long lVar7;
  pointer __k;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::pair<libcellml::CellmlElementType,_std::any>_> __l_00;
  initializer_list<std::pair<libcellml::CellmlElementType,_std::any>_> __l_01;
  initializer_list<std::pair<libcellml::CellmlElementType,_std::any>_> __l_02;
  initializer_list<std::pair<libcellml::CellmlElementType,_std::any>_> __l_03;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>
  __l_04;
  long local_ca8;
  ModelPtr model;
  UnitsItemPtr ua;
  AssertionResult gtest_ar_3;
  allocator_type local_c4b;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_c4a;
  allocator_type local_c49;
  allocator<char> local_c48;
  allocator<char> local_c47;
  allocator<char> local_c46;
  allocator<char> local_c45;
  allocator_type local_c44;
  allocator<char> local_c43;
  allocator<char> local_c42;
  allocator<char> local_c41;
  allocator<char> local_c40;
  allocator_type local_c3f;
  allocator<char> local_c3e;
  allocator<char> local_c3d;
  allocator<char> local_c3c;
  allocator<char> local_c3b;
  allocator_type local_c3a;
  allocator<char> local_c39;
  allocator<char> local_c38;
  allocator<char> local_c37;
  allocator<char> local_c36;
  allocator<char> local_c35;
  allocator<char> local_c34;
  allocator<char> local_c33;
  allocator<char> local_c32;
  allocator<char> local_c31;
  AssertionResult gtest_ar;
  pair<libcellml::CellmlElementType,_std::any> local_c18;
  pair<libcellml::CellmlElementType,_std::any> local_c00;
  pair<libcellml::CellmlElementType,_std::any> local_be8;
  pair<libcellml::CellmlElementType,_std::any> local_bd0;
  pair<libcellml::CellmlElementType,_std::any> local_bb8;
  pair<libcellml::CellmlElementType,_std::any> local_ba0;
  shared_ptr<libcellml::Units> local_b88 [2];
  VariablePtr c4v2;
  VariablePtr c2v2;
  VariablePtr c2v1;
  shared_ptr<libcellml::Units> local_b38 [2];
  AnyCellmlElementPtr item;
  string local_af8 [24];
  undefined1 local_ae0 [40];
  string local_ab8 [16];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  local_aa8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  local_a70;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
  expectedItems;
  VariablePtr c3v1;
  VariablePtr c4v1;
  element_type *local_9e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_9e0;
  element_type *local_9d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_9d0;
  element_type *local_9c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_9c0;
  element_type *local_9b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_9b0;
  element_type *local_9a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_9a0;
  element_type *local_998;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_990;
  element_type *local_988;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_980;
  element_type *local_978;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_970;
  element_type *local_968;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_960;
  element_type *local_958;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_950;
  element_type *local_948;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_940;
  element_type *local_938;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_930;
  element_type *local_928;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_920;
  element_type *local_918;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_910;
  element_type *local_908;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_900;
  element_type *local_8f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_8f0;
  element_type *local_8e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_8e0;
  element_type *local_8d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_8d0;
  element_type *local_8c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_8c0;
  element_type *local_8b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_8b0;
  element_type *local_8a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_8a0;
  element_type *local_898;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_890;
  element_type *local_888;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_880 [2];
  string local_870 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_868;
  string local_860 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_858;
  string local_850 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_848;
  string local_840 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_838;
  string local_830 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_828;
  string local_820 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_818;
  string local_810 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_808;
  string local_800 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_7f8;
  string local_7f0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_7e8;
  string local_7e0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_7d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ids;
  VariablePairPtr testPair;
  pair<libcellml::CellmlElementType,_std::any> local_7a0;
  pair<libcellml::CellmlElementType,_std::any> local_788;
  pair<libcellml::CellmlElementType,_std::any> local_770;
  pair<libcellml::CellmlElementType,_std::any> local_758;
  pair<libcellml::CellmlElementType,_std::any> local_740;
  pair<libcellml::CellmlElementType,_std::any> local_728;
  pair<libcellml::CellmlElementType,_std::any> local_710;
  VariablePairPtr pair;
  pair<libcellml::CellmlElementType,_std::any> local_6e0;
  pair<libcellml::CellmlElementType,_std::any> local_6c8;
  pair<libcellml::CellmlElementType,_std::any> local_6b0;
  pair<libcellml::CellmlElementType,_std::any> local_698;
  pair<libcellml::CellmlElementType,_std::any> local_680;
  pair<libcellml::CellmlElementType,_std::any> local_668;
  pair<libcellml::CellmlElementType,_std::any> local_650;
  ParserPtr parser;
  AnnotatorPtr annotator;
  pair<libcellml::CellmlElementType,_std::any> local_610;
  pair<libcellml::CellmlElementType,_std::any> local_5f8;
  pair<libcellml::CellmlElementType,_std::any> local_5e0;
  pair<libcellml::CellmlElementType,_std::any> local_5c8;
  pair<libcellml::CellmlElementType,_std::any> local_5b0;
  pair<libcellml::CellmlElementType,_std::any> local_598;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::VariablePair>_> local_580;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Variable>_> local_568;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::VariablePair>_> local_550;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Component>_> local_538;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Component>_> local_520;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::UnitsItem>_> local_508;
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  local_4f0;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Model>_> local_4d8;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Component>_> local_4c0;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::VariablePair>_> local_4a8;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Variable>_> local_490;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Variable>_> local_478;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Units>_> local_460;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::ImportSource>_> local_448;
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  local_430;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Variable>_> local_418;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Reset>_> local_400;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Component>_> local_3e8;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Variable>_> local_3d0;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::VariablePair>_> local_3b8;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Units>_> local_3a0;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Units>_> local_388;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Model>_> local_370;
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  local_358;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Variable>_> local_340;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Component>_> local_328;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Reset>_> local_310;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::VariablePair>_> local_2f8;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Component>_> local_2e0;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::VariablePair>_> local_2c8;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::ImportSource>_> local_2b0;
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Units>_> local_298;
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  local_280;
  string local_268 [32];
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Reset>_> local_48;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&item,"duplicateId1",(allocator<char> *)&pair);
  std::__cxx11::string::string<std::allocator<char>>
            (local_af8,"duplicateId2",(allocator<char> *)&testPair);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_ae0 + 8),"duplicateId3",(allocator<char> *)&annotator);
  std::__cxx11::string::string<std::allocator<char>>
            (local_ab8,"duplicateId4",(allocator<char> *)&gtest_ar);
  __l._M_len = 4;
  __l._M_array = (iterator)&item;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&ids,__l,(allocator_type *)&expectedItems);
  lVar5 = 0x60;
  do {
    std::__cxx11::string::~string
              ((string *)
               ((long)&item.
                       super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  libcellml::Parser::create(SUB81(&parser,0));
  libcellml::Parser::parseModel((string *)&model);
  bVar2 = (bool)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&item,"component2",(allocator<char> *)&annotator);
  libcellml::ComponentEntity::component((string *)&testPair,bVar2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pair,"variable1",(allocator<char> *)&gtest_ar);
  libcellml::Component::variable((string *)&c2v1);
  std::__cxx11::string::~string((string *)&pair);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&testPair.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&item);
  bVar2 = (bool)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&item,"component2",(allocator<char> *)&annotator);
  libcellml::ComponentEntity::component((string *)&testPair,bVar2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pair,"variable2",(allocator<char> *)&gtest_ar);
  libcellml::Component::variable((string *)&c2v2);
  std::__cxx11::string::~string((string *)&pair);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&testPair.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&item);
  bVar2 = (bool)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&item,"component2",(allocator<char> *)&expectedItems);
  libcellml::ComponentEntity::component((string *)&gtest_ar,bVar2);
  bVar2 = gtest_ar.success_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pair,"component3",(allocator<char> *)&ua);
  libcellml::ComponentEntity::component((string *)&annotator,bVar2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testPair,"variable1",(allocator<char> *)&gtest_ar_3);
  libcellml::Component::variable((string *)&c3v1);
  std::__cxx11::string::~string((string *)&testPair);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&annotator.super___shared_ptr<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&pair);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&item);
  bVar2 = (bool)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&item,"component4",(allocator<char> *)&annotator);
  libcellml::ComponentEntity::component((string *)&testPair,bVar2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pair,"variable1",(allocator<char> *)&gtest_ar);
  libcellml::Component::variable((string *)&c4v1);
  std::__cxx11::string::~string((string *)&pair);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&testPair.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&item);
  bVar2 = (bool)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&item,"component4",(allocator<char> *)&annotator);
  libcellml::ComponentEntity::component((string *)&testPair,bVar2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pair,"variable2",(allocator<char> *)&gtest_ar);
  libcellml::Component::variable((string *)&c4v2);
  std::__cxx11::string::~string((string *)&pair);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&testPair.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&item);
  std::__cxx11::string::string<std::allocator<char>>((string *)&ua,"units2",&local_c31);
  libcellml::Model::units((string *)&local_888);
  local_298.first = UNITS;
  local_298.second.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_888;
  local_298.second.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = a_Stack_880[0]._M_pi;
  local_888 = (element_type *)0x0;
  a_Stack_880[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Units>,_true>
            ((pair<libcellml::CellmlElementType,_std::any> *)&pair,&local_298);
  bVar2 = (bool)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  std::__cxx11::string::string<std::allocator<char>>((string *)&gtest_ar_3,"component1",&local_c32);
  libcellml::ComponentEntity::component(local_7e0,bVar2);
  libcellml::ImportedEntity::importSource();
  local_2b0.first = IMPORT;
  local_2b0.second.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_898;
  local_2b0.second.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Stack_890._M_pi;
  local_898 = (element_type *)0x0;
  _Stack_890._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::ImportSource>,_true>
            (&local_6e0,&local_2b0);
  libcellml::VariablePair::create((shared_ptr *)&local_8a8,(shared_ptr *)&c4v1);
  local_2c8.first = MAP_VARIABLES;
  local_2c8.second.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_8a8;
  local_2c8.second.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Stack_8a0._M_pi;
  local_8a8 = (element_type *)0x0;
  _Stack_8a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::VariablePair>,_true>
            (&local_6c8,&local_2c8);
  bVar2 = (bool)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_b88,"component2",&local_c33);
  libcellml::ComponentEntity::component((string *)&local_8b8,bVar2);
  local_2e0.first = COMPONENT;
  local_2e0.second.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_8b8;
  local_2e0.second.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Stack_8b0._M_pi;
  local_8b8 = (element_type *)0x0;
  _Stack_8b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Component>,_true>
            (&local_6b0,&local_2e0);
  libcellml::VariablePair::create((shared_ptr *)&local_8c8,(shared_ptr *)&c2v1);
  local_2f8.first = CONNECTION;
  local_2f8.second.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_8c8;
  local_2f8.second.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Stack_8c0._M_pi;
  local_8c8 = (element_type *)0x0;
  _Stack_8c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::VariablePair>,_true>
            (&local_698,&local_2f8);
  bVar2 = (bool)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_b38,"component2",&local_c34);
  libcellml::ComponentEntity::component(local_7f0,bVar2);
  libcellml::Component::reset((ulong)&local_8d8);
  local_310.first = TEST_VALUE;
  local_310.second.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_8d8;
  local_310.second.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Stack_8d0._M_pi;
  local_8d8 = (element_type *)0x0;
  _Stack_8d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Reset>,_true>(&local_680,&local_310)
  ;
  bVar2 = (bool)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  std::__cxx11::string::string<std::allocator<char>>(local_68,"component2",&local_c35);
  libcellml::ComponentEntity::component(local_800,bVar2);
  std::__cxx11::string::string<std::allocator<char>>(local_88,"component3",&local_c36);
  libcellml::ComponentEntity::component((string *)&local_8e8,(bool)local_800[0]);
  local_328.first = COMPONENT_REF;
  local_328.second.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_8e8;
  local_328.second.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Stack_8e0._M_pi;
  local_8e8 = (element_type *)0x0;
  _Stack_8e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Component>,_true>
            (&local_668,&local_328);
  bVar2 = (bool)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  std::__cxx11::string::string<std::allocator<char>>(local_a8,"component2",&local_c37);
  libcellml::ComponentEntity::component(local_820,bVar2);
  std::__cxx11::string::string<std::allocator<char>>(local_c8,"component3",&local_c38);
  libcellml::ComponentEntity::component(local_810,(bool)local_820[0]);
  std::__cxx11::string::string<std::allocator<char>>(local_e8,"variable2",&local_c39);
  libcellml::Component::variable((string *)&local_8f8);
  local_340.first = VARIABLE;
  local_340.second.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_8f8;
  local_340.second.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Stack_8f0._M_pi;
  local_8f8 = (element_type *)0x0;
  _Stack_8f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Variable>,_true>
            (&local_650,&local_340);
  __l_00._M_len = 8;
  __l_00._M_array = (iterator)&pair;
  std::
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  ::vector(&local_280,__l_00,&local_c3a);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  ::pair<const_char_(&)[13],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
              *)&item,(char (*) [13])"duplicateId1",&local_280);
  local_370.first = MODEL;
  std::__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_370.second.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>,
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>);
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Model>,_true>
            ((pair<libcellml::CellmlElementType,_std::any> *)&testPair,&local_370);
  std::__cxx11::string::string<std::allocator<char>>(local_108,"units1",&local_c3b);
  libcellml::Model::units((string *)&local_908);
  local_388.first = UNITS;
  local_388.second.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_908;
  local_388.second.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Stack_900._M_pi;
  local_908 = (element_type *)0x0;
  _Stack_900._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Units>,_true>(&local_7a0,&local_388)
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_128,"blob",&local_c3c);
  libcellml::Model::units((string *)&local_918);
  local_3a0.first = UNITS;
  local_3a0.second.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_918;
  local_3a0.second.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Stack_910._M_pi;
  local_918 = (element_type *)0x0;
  _Stack_910._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Units>,_true>(&local_788,&local_3a0)
  ;
  libcellml::VariablePair::create((shared_ptr *)&local_928,(shared_ptr *)&c4v2);
  local_3b8.first = CONNECTION;
  local_3b8.second.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_928;
  local_3b8.second.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Stack_920._M_pi;
  local_928 = (element_type *)0x0;
  _Stack_920._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::VariablePair>,_true>
            (&local_770,&local_3b8);
  local_3d0.first = VARIABLE;
  std::__shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_3d0.second.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>,
             &c4v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>);
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Variable>,_true>
            (&local_758,&local_3d0);
  bVar2 = (bool)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  std::__cxx11::string::string<std::allocator<char>>(local_148,"component2",&local_c3d);
  libcellml::ComponentEntity::component((string *)&local_938,bVar2);
  local_3e8.first = COMPONENT_REF;
  local_3e8.second.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_938;
  local_3e8.second.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Stack_930._M_pi;
  local_938 = (element_type *)0x0;
  _Stack_930._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Component>,_true>
            (&local_740,&local_3e8);
  bVar2 = (bool)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  std::__cxx11::string::string<std::allocator<char>>(local_168,"component2",&local_c3e);
  libcellml::ComponentEntity::component(local_830,bVar2);
  libcellml::Component::reset((ulong)&local_948);
  local_400.first = RESET;
  local_400.second.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_948;
  local_400.second.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Stack_940._M_pi;
  local_948 = (element_type *)0x0;
  _Stack_940._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Reset>,_true>(&local_728,&local_400)
  ;
  local_418.first = VARIABLE;
  std::__shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_418.second.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>,
             &c3v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>);
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Variable>,_true>
            (&local_710,&local_418);
  __l_01._M_len = 8;
  __l_01._M_array = (iterator)&testPair;
  std::
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  ::vector(&local_358,__l_01,&local_c3f);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  ::pair<const_char_(&)[13],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
              *)local_ae0,(char (*) [13])"duplicateId2",&local_358);
  std::__cxx11::string::string<std::allocator<char>>(local_188,"units1",&local_c40);
  libcellml::Model::units(local_840);
  libcellml::ImportedEntity::importSource();
  local_448.first = IMPORT;
  local_448.second.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_958;
  local_448.second.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Stack_950._M_pi;
  local_958 = (element_type *)0x0;
  _Stack_950._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::ImportSource>,_true>
            ((pair<libcellml::CellmlElementType,_std::any> *)&annotator,&local_448);
  std::__cxx11::string::string<std::allocator<char>>(local_1a8,"units3",&local_c41);
  libcellml::Model::units((string *)&local_968);
  local_460.first = UNITS;
  local_460.second.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_968;
  local_460.second.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Stack_960._M_pi;
  local_968 = (element_type *)0x0;
  _Stack_960._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Units>,_true>(&local_610,&local_460)
  ;
  local_478.first = VARIABLE;
  std::__shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_478.second.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>,
             &c4v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>);
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Variable>,_true>
            (&local_5f8,&local_478);
  local_490.first = VARIABLE;
  std::__shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_490.second.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>,
             &c2v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>);
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Variable>,_true>
            (&local_5e0,&local_490);
  libcellml::VariablePair::create((shared_ptr *)&local_978,(shared_ptr *)&c2v2);
  local_4a8.first = MAP_VARIABLES;
  local_4a8.second.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_978;
  local_4a8.second.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Stack_970._M_pi;
  local_978 = (element_type *)0x0;
  _Stack_970._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::VariablePair>,_true>
            (&local_5c8,&local_4a8);
  bVar2 = (bool)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  std::__cxx11::string::string<std::allocator<char>>(local_1c8,"component2",&local_c42);
  libcellml::ComponentEntity::component(local_850,bVar2);
  std::__cxx11::string::string<std::allocator<char>>(local_1e8,"component3",&local_c43);
  libcellml::ComponentEntity::component((string *)&local_988,(bool)local_850[0]);
  local_4c0.first = COMPONENT;
  local_4c0.second.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_988;
  local_4c0.second.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Stack_980._M_pi;
  local_988 = (element_type *)0x0;
  _Stack_980._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Component>,_true>
            (&local_5b0,&local_4c0);
  local_4d8.first = ENCAPSULATION;
  std::__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_4d8.second.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>,
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>);
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Model>,_true>(&local_598,&local_4d8)
  ;
  __l_02._M_len = 7;
  __l_02._M_array = (iterator)&annotator;
  std::
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  ::vector(&local_430,__l_02,&local_c44);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  ::pair<const_char_(&)[13],_true>(&local_aa8,(char (*) [13])"duplicateId3",&local_430);
  std::__cxx11::string::string<std::allocator<char>>(local_208,"units2",&local_c45);
  libcellml::Model::units(local_860);
  libcellml::UnitsItem::create((shared_ptr *)&local_998,(ulong)local_860);
  local_508.first = UNIT;
  local_508.second.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_998;
  local_508.second.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Stack_990._M_pi;
  local_998 = (element_type *)0x0;
  _Stack_990._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::UnitsItem>,_true>
            ((pair<libcellml::CellmlElementType,_std::any> *)&gtest_ar,&local_508);
  bVar2 = (bool)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  std::__cxx11::string::string<std::allocator<char>>(local_228,"component1",&local_c46);
  libcellml::ComponentEntity::component((string *)&local_9a8,bVar2);
  local_520.first = COMPONENT;
  local_520.second.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_9a8;
  local_520.second.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Stack_9a0._M_pi;
  local_9a8 = (element_type *)0x0;
  _Stack_9a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Component>,_true>
            (&local_c18,&local_520);
  bVar2 = (bool)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  std::__cxx11::string::string<std::allocator<char>>(local_248,"component4",&local_c47);
  libcellml::ComponentEntity::component((string *)&local_9b8,bVar2);
  local_538.first = COMPONENT;
  local_538.second.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_9b8;
  local_538.second.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Stack_9b0._M_pi;
  local_9b8 = (element_type *)0x0;
  _Stack_9b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Component>,_true>
            (&local_c00,&local_538);
  libcellml::VariablePair::create((shared_ptr *)&local_9c8,(shared_ptr *)&c2v1);
  local_550.first = MAP_VARIABLES;
  local_550.second.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_9c8;
  local_550.second.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Stack_9c0._M_pi;
  local_9c8 = (element_type *)0x0;
  _Stack_9c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::VariablePair>,_true>
            (&local_be8,&local_550);
  local_568.first = VARIABLE;
  std::__shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_568.second.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>,
             &c2v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>);
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Variable>,_true>
            (&local_bd0,&local_568);
  libcellml::VariablePair::create((shared_ptr *)&local_9d8,(shared_ptr *)&c2v2);
  local_580.first = MAP_VARIABLES;
  local_580.second.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_9d8;
  local_580.second.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Stack_9d0._M_pi;
  local_9d8 = (element_type *)0x0;
  _Stack_9d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::VariablePair>,_true>
            (&local_bb8,&local_580);
  std::__cxx11::string::string<std::allocator<char>>(local_268,"component2",&local_c48);
  libcellml::ComponentEntity::component
            (local_870,
             (bool)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                   _0_1_);
  libcellml::Component::reset((ulong)&local_9e8);
  local_48.first = RESET_VALUE;
  local_48.second.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_9e8;
  local_48.second.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Stack_9e0._M_pi;
  local_9e8 = (element_type *)0x0;
  _Stack_9e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::pair<libcellml::CellmlElementType,_std::any>::
  pair<libcellml::CellmlElementType,_std::shared_ptr<libcellml::Reset>,_true>(&local_ba0,&local_48);
  __l_03._M_len = 7;
  __l_03._M_array = (iterator)&gtest_ar;
  std::
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  ::vector(&local_4f0,__l_03,&local_c49);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
  ::pair<const_char_(&)[13],_true>(&local_a70,(char (*) [13])"duplicateId4",&local_4f0);
  __l_04._M_len = 4;
  __l_04._M_array = (iterator)&item;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
  ::map(&expectedItems,__l_04,&local_c4a,&local_c4b);
  lVar5 = 0xa8;
  do {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>
             *)((long)&item.
                       super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr + lVar5));
    lVar5 = lVar5 + -0x38;
  } while (lVar5 != -0x38);
  std::
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  ::~vector(&local_4f0);
  lVar5 = 0x98;
  do {
    std::any::reset((any *)(&gtest_ar.success_ + lVar5));
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != -0x10);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.second.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_9e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_868);
  std::__cxx11::string::~string(local_268);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_580.second.
              super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_9d0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_568.second.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_550.second.
              super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_9c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_538.second.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_9b0);
  std::__cxx11::string::~string(local_248);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_520.second.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_9a0);
  std::__cxx11::string::~string(local_228);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_508.second.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_990);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_858);
  std::__cxx11::string::~string(local_208);
  std::
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  ::~vector(&local_430);
  lVar5 = 0x98;
  do {
    std::any::reset((any *)((long)&annotator.
                                   super___shared_ptr<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr + lVar5));
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != -0x10);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_4d8.second.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_4c0.second.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_980);
  std::__cxx11::string::~string(local_1e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_848);
  std::__cxx11::string::~string(local_1c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_4a8.second.
              super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_970);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_490.second.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_478.second.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_460.second.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_960);
  std::__cxx11::string::~string(local_1a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_448.second.
              super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_950);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_838);
  std::__cxx11::string::~string(local_188);
  std::
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  ::~vector(&local_358);
  lVar5 = 0xb0;
  do {
    std::any::reset((any *)((long)&testPair.
                                   super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr + lVar5));
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != -0x10);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_418.second.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_400.second.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_940);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_828);
  std::__cxx11::string::~string(local_168);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_3e8.second.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_930);
  std::__cxx11::string::~string(local_148);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_3d0.second.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_3b8.second.
              super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_920);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_3a0.second.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_910);
  std::__cxx11::string::~string(local_128);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_388.second.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_900);
  std::__cxx11::string::~string(local_108);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_370.second.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
  ::~vector(&local_280);
  lVar5 = 0xb0;
  do {
    std::any::reset((any *)((long)&pair.
                                   super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr + lVar5));
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != -0x10);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_340.second.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_8f0);
  std::__cxx11::string::~string(local_e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_808);
  std::__cxx11::string::~string(local_c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_818);
  std::__cxx11::string::~string(local_a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_328.second.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_8e0);
  std::__cxx11::string::~string(local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_7f8);
  std::__cxx11::string::~string(local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_310.second.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_8d0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_7e8);
  std::__cxx11::string::~string((string *)local_b38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_2f8.second.
              super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_8c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_2e0.second.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_8b0);
  std::__cxx11::string::~string((string *)local_b88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_2c8.second.
              super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_8a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_2b0.second.
              super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_890);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_7d8);
  std::__cxx11::string::~string((string *)&gtest_ar_3);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_298.second.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_880);
  std::__cxx11::string::~string((string *)&ua);
  pair.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  pair.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  testPair.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  testPair.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  libcellml::Annotator::create();
  libcellml::Annotator::setModel
            ((shared_ptr *)
             annotator.super___shared_ptr<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Annotator::duplicateIds_abi_cxx11_();
  testing::internal::
  CmpHelperEQ<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((internal *)&gtest_ar,"ids","annotator->duplicateIds()",&ids,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&item);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&item);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&item);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&ua,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x7b2,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&ua,(Message *)&item);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ua);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&item);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  __k = ids.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (__k == ids.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&annotator.super___shared_ptr<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&testPair.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&pair.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
      ::~_Rb_tree(&expectedItems._M_t);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&c4v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&c4v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&c3v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&c2v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&c2v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&ids);
      return;
    }
    lVar5 = libcellml::Annotator::itemCount
                      ((string *)
                       annotator.
                       super___shared_ptr<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    local_ca8 = 8;
    for (lVar7 = 0; lVar5 != lVar7; lVar7 = lVar7 + 1) {
      libcellml::Annotator::item
                ((string *)&item,
                 (ulong)annotator.
                        super___shared_ptr<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ;
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
               ::operator[](&expectedItems,__k);
      ppVar1 = (pmVar4->
               super__Vector_base<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      ua.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
           libcellml::AnyCellmlElement::type();
      testing::internal::CmpHelperEQ<libcellml::CellmlElementType,libcellml::CellmlElementType>
                ((internal *)&gtest_ar,"expectedItems[id][index].first","item->type()",
                 (CellmlElementType *)((long)ppVar1 + local_ca8 + -8),(CellmlElementType *)&ua);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&ua);
        pcVar6 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                   ,0x7b9,pcVar6);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&ua);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&ua);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      uVar3 = libcellml::AnyCellmlElement::type();
      switch(uVar3) {
      case 0:
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
        ::operator[](&expectedItems,__k);
        std::any_cast<std::shared_ptr<libcellml::Component>>((any *)&ua);
        libcellml::AnyCellmlElement::component();
        testing::internal::
        CmpHelperEQ<std::shared_ptr<libcellml::Component>,std::shared_ptr<libcellml::Component>>
                  ((internal *)&gtest_ar,
                   "std::any_cast<libcellml::ComponentPtr>(expectedItems[id][index].second)",
                   "item->component()",(shared_ptr<libcellml::Component> *)&ua,
                   (shared_ptr<libcellml::Component> *)&gtest_ar_3);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar_3.message_);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&ua.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&ua);
          pcVar6 = "";
          if (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                     ,0x7bd,pcVar6);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&ua);
LAB_00144ec4:
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&ua);
        }
        break;
      case 1:
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
        ::operator[](&expectedItems,__k);
        std::any_cast<std::shared_ptr<libcellml::Component>>((any *)&ua);
        libcellml::AnyCellmlElement::component();
        testing::internal::
        CmpHelperEQ<std::shared_ptr<libcellml::Component>,std::shared_ptr<libcellml::Component>>
                  ((internal *)&gtest_ar,
                   "std::any_cast<libcellml::ComponentPtr>(expectedItems[id][index].second)",
                   "item->component()",(shared_ptr<libcellml::Component> *)&ua,
                   (shared_ptr<libcellml::Component> *)&gtest_ar_3);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar_3.message_);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&ua.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&ua);
          pcVar6 = "";
          if (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                     ,0x7c0,pcVar6);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&ua);
          goto LAB_00144ec4;
        }
        break;
      case 2:
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
        ::operator[](&expectedItems,__k);
        std::any_cast<std::shared_ptr<libcellml::VariablePair>>((any *)&gtest_ar);
        std::__shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&pair.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2> *)&gtest_ar);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar.message_);
        libcellml::AnyCellmlElement::variablePair();
        goto LAB_00144b0e;
      case 3:
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
        ::operator[](&expectedItems,__k);
        std::any_cast<std::shared_ptr<libcellml::Model>>((any *)&ua);
        libcellml::AnyCellmlElement::model();
        testing::internal::
        CmpHelperEQ<std::shared_ptr<libcellml::Model>,std::shared_ptr<libcellml::Model>>
                  ((internal *)&gtest_ar,
                   "std::any_cast<libcellml::ModelPtr>(expectedItems[id][index].second)",
                   "item->model()",(shared_ptr<libcellml::Model> *)&ua,
                   (shared_ptr<libcellml::Model> *)&gtest_ar_3);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar_3.message_);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&ua.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&ua);
          pcVar6 = "";
          if (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                     ,0x7c7,pcVar6);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&ua);
          goto LAB_00144ec4;
        }
        break;
      case 4:
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
        ::operator[](&expectedItems,__k);
        std::any_cast<std::shared_ptr<libcellml::ImportSource>>((any *)&ua);
        libcellml::AnyCellmlElement::importSource();
        testing::internal::
        CmpHelperEQ<std::shared_ptr<libcellml::ImportSource>,std::shared_ptr<libcellml::ImportSource>>
                  ((internal *)&gtest_ar,
                   "std::any_cast<libcellml::ImportSourcePtr>(expectedItems[id][index].second)",
                   "item->importSource()",(shared_ptr<libcellml::ImportSource> *)&ua,
                   (shared_ptr<libcellml::ImportSource> *)&gtest_ar_3);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar_3.message_);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&ua.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&ua);
          pcVar6 = "";
          if (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                     ,0x7ca,pcVar6);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&ua);
          goto LAB_00144ec4;
        }
        break;
      case 5:
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
        ::operator[](&expectedItems,__k);
        std::any_cast<std::shared_ptr<libcellml::VariablePair>>((any *)&gtest_ar);
        std::__shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&pair.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2> *)&gtest_ar);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar.message_);
        libcellml::AnyCellmlElement::variablePair();
LAB_00144b0e:
        std::__shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&testPair.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>
                   ,(__shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2> *)&gtest_ar);
LAB_00144b1e:
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar.message_);
      default:
        goto switchD_001444e2_caseD_6;
      case 7:
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
        ::operator[](&expectedItems,__k);
        std::any_cast<std::shared_ptr<libcellml::Model>>((any *)&ua);
        libcellml::AnyCellmlElement::model();
        testing::internal::
        CmpHelperEQ<std::shared_ptr<libcellml::Model>,std::shared_ptr<libcellml::Model>>
                  ((internal *)&gtest_ar,
                   "std::any_cast<libcellml::ModelPtr>(expectedItems[id][index].second)",
                   "item->model()",(shared_ptr<libcellml::Model> *)&ua,
                   (shared_ptr<libcellml::Model> *)&gtest_ar_3);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar_3.message_);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&ua.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&ua);
          pcVar6 = "";
          if (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                     ,0x7d1,pcVar6);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&ua);
          goto LAB_00144ec4;
        }
        break;
      case 8:
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
        ::operator[](&expectedItems,__k);
        std::any_cast<std::shared_ptr<libcellml::Reset>>((any *)&ua);
        libcellml::AnyCellmlElement::reset();
        testing::internal::
        CmpHelperEQ<std::shared_ptr<libcellml::Reset>,std::shared_ptr<libcellml::Reset>>
                  ((internal *)&gtest_ar,
                   "std::any_cast<libcellml::ResetPtr>(expectedItems[id][index].second)",
                   "item->reset()",(shared_ptr<libcellml::Reset> *)&ua,
                   (shared_ptr<libcellml::Reset> *)&gtest_ar_3);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar_3.message_);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&ua.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&ua);
          pcVar6 = "";
          if (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                     ,0x7d4,pcVar6);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&ua);
          goto LAB_00144ec4;
        }
        break;
      case 9:
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
        ::operator[](&expectedItems,__k);
        std::any_cast<std::shared_ptr<libcellml::Reset>>((any *)&ua);
        libcellml::AnyCellmlElement::reset();
        testing::internal::
        CmpHelperEQ<std::shared_ptr<libcellml::Reset>,std::shared_ptr<libcellml::Reset>>
                  ((internal *)&gtest_ar,
                   "std::any_cast<libcellml::ResetPtr>(expectedItems[id][index].second)",
                   "item->reset()",(shared_ptr<libcellml::Reset> *)&ua,
                   (shared_ptr<libcellml::Reset> *)&gtest_ar_3);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar_3.message_);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&ua.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&ua);
          pcVar6 = "";
          if (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                     ,0x7d7,pcVar6);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&ua);
          goto LAB_00144ec4;
        }
        break;
      case 10:
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
        ::operator[](&expectedItems,__k);
        std::any_cast<std::shared_ptr<libcellml::Reset>>((any *)&ua);
        libcellml::AnyCellmlElement::reset();
        testing::internal::
        CmpHelperEQ<std::shared_ptr<libcellml::Reset>,std::shared_ptr<libcellml::Reset>>
                  ((internal *)&gtest_ar,
                   "std::any_cast<libcellml::ResetPtr>(expectedItems[id][index].second)",
                   "item->reset()",(shared_ptr<libcellml::Reset> *)&ua,
                   (shared_ptr<libcellml::Reset> *)&gtest_ar_3);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar_3.message_);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&ua.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&ua);
          pcVar6 = "";
          if (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                     ,0x7da,pcVar6);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&ua);
          goto LAB_00144ec4;
        }
        break;
      case 0xc:
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
        ::operator[](&expectedItems,__k);
        std::any_cast<std::shared_ptr<libcellml::UnitsItem>>((any *)&gtest_ar);
        libcellml::AnyCellmlElement::unitsItem();
        libcellml::UnitsItem::units();
        libcellml::UnitsItem::units();
        testing::internal::
        CmpHelperEQ<std::shared_ptr<libcellml::Units>,std::shared_ptr<libcellml::Units>>
                  ((internal *)&gtest_ar_3,"ue->units()","ua->units()",local_b88,local_b38);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_b38[0].super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_b88[0].super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        if (gtest_ar_3.success_ == false) {
          testing::Message::Message((Message *)local_b88);
          pcVar6 = "";
          if (gtest_ar_3.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar6 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_b38,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                     ,0x7df,pcVar6);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_b38,(Message *)local_b88)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b38);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_b88);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_3.message_);
        local_b88[0].super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)libcellml::UnitsItem::index();
        local_b38[0].super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)libcellml::UnitsItem::index();
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  ((internal *)&gtest_ar_3,"ue->index()","ua->index()",(unsigned_long *)local_b88,
                   (unsigned_long *)local_b38);
        if (gtest_ar_3.success_ == false) {
          testing::Message::Message((Message *)local_b88);
          pcVar6 = "";
          if (gtest_ar_3.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar6 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_b38,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                     ,0x7e0,pcVar6);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_b38,(Message *)local_b88)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b38);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_b88);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_3.message_);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&ua.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        goto LAB_00144b1e;
      case 0xd:
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
        ::operator[](&expectedItems,__k);
        std::any_cast<std::shared_ptr<libcellml::Units>>((any *)&ua);
        libcellml::AnyCellmlElement::units();
        testing::internal::
        CmpHelperEQ<std::shared_ptr<libcellml::Units>,std::shared_ptr<libcellml::Units>>
                  ((internal *)&gtest_ar,
                   "std::any_cast<libcellml::UnitsPtr>(expectedItems[id][index].second)",
                   "item->units()",(shared_ptr<libcellml::Units> *)&ua,
                   (shared_ptr<libcellml::Units> *)&gtest_ar_3);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar_3.message_);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&ua.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&ua);
          pcVar6 = "";
          if (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                     ,0x7e4,pcVar6);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&ua);
          goto LAB_00144ec4;
        }
        break;
      case 0xe:
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<libcellml::CellmlElementType,_std::any>,_std::allocator<std::pair<libcellml::CellmlElementType,_std::any>_>_>_>_>_>
        ::operator[](&expectedItems,__k);
        std::any_cast<std::shared_ptr<libcellml::Variable>>((any *)&ua);
        libcellml::AnyCellmlElement::variable();
        testing::internal::
        CmpHelperEQ<std::shared_ptr<libcellml::Variable>,std::shared_ptr<libcellml::Variable>>
                  ((internal *)&gtest_ar,
                   "std::any_cast<libcellml::VariablePtr>(expectedItems[id][index].second)",
                   "item->variable()",(shared_ptr<libcellml::Variable> *)&ua,
                   (shared_ptr<libcellml::Variable> *)&gtest_ar_3);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar_3.message_);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&ua.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&ua);
          pcVar6 = "";
          if (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
                     ,0x7e7,pcVar6);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&ua);
          goto LAB_00144ec4;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
switchD_001444e2_caseD_6:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&item.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      local_ca8 = local_ca8 + 0x18;
    }
    __k = __k + 1;
  } while( true );
}

Assistant:

TEST(Annotator, retrieveDuplicateIdItemsWithIndex)
{
    std::vector<std::string> ids = {
        "duplicateId1",
        "duplicateId2",
        "duplicateId3",
        "duplicateId4",
    };

    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(modelStringLotsOfDuplicateIds);

    auto c2v1 = model->component("component2")->variable("variable1");
    auto c2v2 = model->component("component2")->variable("variable2");
    auto c3v1 = model->component("component2")->component("component3")->variable("variable1");
    auto c4v1 = model->component("component4")->variable("variable1");
    auto c4v2 = model->component("component4")->variable("variable2");

    std::map<std::string, std::vector<std::pair<libcellml::CellmlElementType, std::any>>> expectedItems = {
        {"duplicateId1", {
                             std::make_pair(libcellml::CellmlElementType::UNITS, model->units("units2")),
                             std::make_pair(libcellml::CellmlElementType::IMPORT, model->component("component1")->importSource()),
                             std::make_pair(libcellml::CellmlElementType::MAP_VARIABLES, libcellml::VariablePair::create(c4v1, c2v1)),
                             std::make_pair(libcellml::CellmlElementType::COMPONENT, model->component("component2")),
                             std::make_pair(libcellml::CellmlElementType::CONNECTION, libcellml::VariablePair::create(c2v1, c3v1)),
                             std::make_pair(libcellml::CellmlElementType::TEST_VALUE, model->component("component2")->reset(0)),
                             std::make_pair(libcellml::CellmlElementType::COMPONENT_REF, model->component("component2")->component("component3")),
                             std::make_pair(libcellml::CellmlElementType::VARIABLE, model->component("component2")->component("component3")->variable("variable2")),
                         }},
        {"duplicateId2", {
                             std::make_pair(libcellml::CellmlElementType::MODEL, model),
                             std::make_pair(libcellml::CellmlElementType::UNITS, model->units("units1")),
                             std::make_pair(libcellml::CellmlElementType::UNITS, model->units("blob")),
                             std::make_pair(libcellml::CellmlElementType::CONNECTION, libcellml::VariablePair::create(c4v2, c2v2)),
                             std::make_pair(libcellml::CellmlElementType::VARIABLE, c4v2),
                             std::make_pair(libcellml::CellmlElementType::COMPONENT_REF, model->component("component2")),
                             std::make_pair(libcellml::CellmlElementType::RESET, model->component("component2")->reset(0)),
                             std::make_pair(libcellml::CellmlElementType::VARIABLE, c3v1),
                         }},
        {"duplicateId3", {
                             std::make_pair(libcellml::CellmlElementType::IMPORT, model->units("units1")->importSource()),
                             std::make_pair(libcellml::CellmlElementType::UNITS, model->units("units3")),
                             std::make_pair(libcellml::CellmlElementType::VARIABLE, c4v1),
                             std::make_pair(libcellml::CellmlElementType::VARIABLE, c2v2),
                             std::make_pair(libcellml::CellmlElementType::MAP_VARIABLES, libcellml::VariablePair::create(c2v2, c4v2)),
                             std::make_pair(libcellml::CellmlElementType::COMPONENT, model->component("component2")->component("component3")),
                             std::make_pair(libcellml::CellmlElementType::ENCAPSULATION, model),
                         }},
        {"duplicateId4", {
                             std::make_pair(libcellml::CellmlElementType::UNIT, libcellml::UnitsItem::create(model->units("units2"), 0)),
                             std::make_pair(libcellml::CellmlElementType::COMPONENT, model->component("component1")),
                             std::make_pair(libcellml::CellmlElementType::COMPONENT, model->component("component4")),
                             std::make_pair(libcellml::CellmlElementType::MAP_VARIABLES, libcellml::VariablePair::create(c2v1, c3v1)),
                             std::make_pair(libcellml::CellmlElementType::VARIABLE, c2v1),
                             std::make_pair(libcellml::CellmlElementType::MAP_VARIABLES, libcellml::VariablePair::create(c2v2, c4v2)),
                             std::make_pair(libcellml::CellmlElementType::RESET_VALUE, model->component("component2")->reset(0)),
                         }},

    };

    libcellml::VariablePairPtr pair;
    libcellml::VariablePairPtr testPair;

    auto annotator = libcellml::Annotator::create();
    annotator->setModel(model);

    EXPECT_EQ(ids, annotator->duplicateIds());

    for (const auto &id : ids) {
        auto num = annotator->itemCount(id);
        for (size_t index = 0; index < num; ++index) {
            libcellml::AnyCellmlElementPtr item = annotator->item(id, index);

            EXPECT_EQ(expectedItems[id][index].first, item->type());

            switch (item->type()) {
            case libcellml::CellmlElementType::COMPONENT:
                EXPECT_EQ(std::any_cast<libcellml::ComponentPtr>(expectedItems[id][index].second), item->component());
                break;
            case libcellml::CellmlElementType::COMPONENT_REF:
                EXPECT_EQ(std::any_cast<libcellml::ComponentPtr>(expectedItems[id][index].second), item->component());
                break;
            case libcellml::CellmlElementType::CONNECTION:
                pair = std::any_cast<libcellml::VariablePairPtr>(expectedItems[id][index].second);
                testPair = item->variablePair();
                break;
            case libcellml::CellmlElementType::ENCAPSULATION:
                EXPECT_EQ(std::any_cast<libcellml::ModelPtr>(expectedItems[id][index].second), item->model());
                break;
            case libcellml::CellmlElementType::IMPORT:
                EXPECT_EQ(std::any_cast<libcellml::ImportSourcePtr>(expectedItems[id][index].second), item->importSource());
                break;
            case libcellml::CellmlElementType::MAP_VARIABLES:
                pair = std::any_cast<libcellml::VariablePairPtr>(expectedItems[id][index].second);
                testPair = item->variablePair();
                break;
            case libcellml::CellmlElementType::MODEL:
                EXPECT_EQ(std::any_cast<libcellml::ModelPtr>(expectedItems[id][index].second), item->model());
                break;
            case libcellml::CellmlElementType::RESET:
                EXPECT_EQ(std::any_cast<libcellml::ResetPtr>(expectedItems[id][index].second), item->reset());
                break;
            case libcellml::CellmlElementType::RESET_VALUE:
                EXPECT_EQ(std::any_cast<libcellml::ResetPtr>(expectedItems[id][index].second), item->reset());
                break;
            case libcellml::CellmlElementType::TEST_VALUE:
                EXPECT_EQ(std::any_cast<libcellml::ResetPtr>(expectedItems[id][index].second), item->reset());
                break;
            case libcellml::CellmlElementType::UNIT: {
                auto ue = std::any_cast<libcellml::UnitsItemPtr>(expectedItems[id][index].second);
                auto ua = item->unitsItem();
                EXPECT_EQ(ue->units(), ua->units());
                EXPECT_EQ(ue->index(), ua->index());
                break;
            }
            case libcellml::CellmlElementType::UNITS:
                EXPECT_EQ(std::any_cast<libcellml::UnitsPtr>(expectedItems[id][index].second), item->units());
                break;
            case libcellml::CellmlElementType::VARIABLE:
                EXPECT_EQ(std::any_cast<libcellml::VariablePtr>(expectedItems[id][index].second), item->variable());
                break;
            case libcellml::CellmlElementType::MATH:
            case libcellml::CellmlElementType::UNDEFINED:
                break;
            }
        }
    }
}